

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O0

void __thiscall
tchecker::syncprod::details::
transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
::transition_pool_allocator_t
          (transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
           *this,size_t transition_alloc_nb,size_t vedge_alloc_nb,size_t vedge_capacity,
          size_t table_size)

{
  size_t alloc_nb;
  size_t alloc_size;
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *this_00;
  shared_ptr<tchecker::collectable_t> local_50 [2];
  size_t local_30;
  size_t table_size_local;
  size_t vedge_capacity_local;
  size_t vedge_alloc_nb_local;
  size_t transition_alloc_nb_local;
  transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
  *this_local;
  
  local_30 = table_size;
  table_size_local = vedge_capacity;
  vedge_capacity_local = vedge_alloc_nb;
  vedge_alloc_nb_local = transition_alloc_nb;
  transition_alloc_nb_local = (size_t)this;
  tchecker::ts::
  transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
  ::transition_pool_allocator_t
            (&this->
              super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::syncprod::transition_t,_unsigned_long,_1UL>_>
             ,transition_alloc_nb);
  alloc_nb = vedge_capacity_local;
  this->_vedge_capacity = table_size_local;
  alloc_size = allocation_size_t<tchecker::make_shared_t<tchecker::vedge_t,unsigned_long,1ul>>::
               alloc_size<unsigned_long&>(&this->_vedge_capacity);
  pool_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::pool_t
            (&this->_vedge_pool,alloc_nb,alloc_size);
  this_00 = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
             *)operator_new(0x58);
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  ::periodic_collectable_cache_t(this_00,local_30);
  std::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>>
  ::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            ((shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>>
              *)&this->_vedge_cache,this_00);
  std::shared_ptr<tchecker::collectable_t>::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vedge_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            (local_50,&this->_vedge_cache);
  pool_t<tchecker::make_shared_t<tchecker::vedge_t,_unsigned_long,_1UL>_>::enroll
            (&this->_vedge_pool,local_50);
  std::shared_ptr<tchecker::collectable_t>::~shared_ptr(local_50);
  return;
}

Assistant:

transition_pool_allocator_t(std::size_t transition_alloc_nb, std::size_t vedge_alloc_nb, std::size_t vedge_capacity,
                              std::size_t table_size)
      : tchecker::ts::transition_pool_allocator_t<TRANSITION>(transition_alloc_nb), _vedge_capacity(vedge_capacity),
        _vedge_pool(vedge_alloc_nb, tchecker::allocation_size_t<tchecker::shared_vedge_t>::alloc_size(_vedge_capacity)),
        _vedge_cache(new vedge_cache_t(table_size))
  {
    _vedge_pool.enroll(_vedge_cache);
  }